

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  char *pKey;
  char *pH;
  char *__s;
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  char **aNew;
  sqlite3_int64 nNew;
  void *pvStack_68;
  int iArg;
  char **aArg;
  sqlite3_tokenizer_module *m;
  char *zEnd;
  char *zCopy;
  char *pcStack_40;
  int n;
  char *z;
  char **ppcStack_30;
  int rc;
  char **pzErr_local;
  sqlite3_tokenizer **ppTok_local;
  char *zArg_local;
  Fts3Hash *pHash_local;
  
  zCopy._4_4_ = 0;
  pcStack_40 = zArg;
  ppcStack_30 = pzErr;
  pzErr_local = (char **)ppTok;
  ppTok_local = (sqlite3_tokenizer **)zArg;
  zArg_local = &pHash->keyClass;
  __s = sqlite3_mprintf("%s",zArg);
  if (__s == (char *)0x0) {
    pHash_local._4_4_ = 7;
  }
  else {
    sVar1 = strlen(__s);
    pcStack_40 = sqlite3Fts3NextToken(__s,(int *)((long)&zCopy + 4));
    if (pcStack_40 == (char *)0x0) {
      pcStack_40 = __s;
    }
    pcStack_40[zCopy._4_4_] = '\0';
    sqlite3Fts3Dequote(pcStack_40);
    pH = zArg_local;
    pKey = pcStack_40;
    sVar2 = strlen(pcStack_40);
    pvVar3 = sqlite3Fts3HashFind((Fts3Hash *)pH,pKey,(int)sVar2 + 1);
    if (pvVar3 == (void *)0x0) {
      sqlite3Fts3ErrMsg(ppcStack_30,"unknown tokenizer: %s",pcStack_40);
      z._4_4_ = 1;
LAB_001fbda0:
      sqlite3_free(__s);
      pHash_local._4_4_ = z._4_4_;
    }
    else {
      pvStack_68 = (void *)0x0;
      nNew._4_4_ = 0;
      pcStack_40 = pcStack_40 + (zCopy._4_4_ + 1);
      while( true ) {
        bVar5 = false;
        if (pcStack_40 < __s + sVar1) {
          pcStack_40 = sqlite3Fts3NextToken(pcStack_40,(int *)((long)&zCopy + 4));
          bVar5 = pcStack_40 != (char *)0x0;
        }
        if (!bVar5) {
          z._4_4_ = (**(code **)((long)pvVar3 + 8))(nNew._4_4_,pvStack_68,pzErr_local);
          if (z._4_4_ == 0) {
            *(void **)*pzErr_local = pvVar3;
          }
          else {
            sqlite3Fts3ErrMsg(ppcStack_30,"unknown tokenizer");
          }
          sqlite3_free(pvStack_68);
          goto LAB_001fbda0;
        }
        pvVar4 = sqlite3_realloc64(pvStack_68,(long)(nNew._4_4_ + 1) << 3);
        if (pvVar4 == (void *)0x0) break;
        *(char **)((long)pvVar4 + (long)nNew._4_4_ * 8) = pcStack_40;
        pcStack_40[zCopy._4_4_] = '\0';
        sqlite3Fts3Dequote(pcStack_40);
        pcStack_40 = pcStack_40 + (zCopy._4_4_ + 1);
        nNew._4_4_ = nNew._4_4_ + 1;
        pvStack_68 = pvVar4;
      }
      sqlite3_free(__s);
      sqlite3_free(pvStack_68);
      pHash_local._4_4_ = 7;
    }
  }
  return pHash_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}